

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O0

bool __thiscall
S2RegionCoverer::IsCanonical
          (S2RegionCoverer *this,vector<S2CellId,_std::allocator<S2CellId>_> *covering)

{
  vector<S2CellId,_std::allocator<S2CellId>_> *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  size_type sVar10;
  reference pSVar11;
  S2CellId SVar12;
  S2CellId SVar13;
  bool local_f9;
  int plevel;
  S2CellId SStack_88;
  int level;
  S2CellId id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<S2CellId,_std::allocator<S2CellId>_> *__range1;
  S2CellId prev_id;
  int same_parent_count;
  bool too_many_cells;
  int level_mod;
  int max_level;
  int min_level;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  vector<S2CellId,_std::allocator<S2CellId>_> *local_20;
  vector<S2CellId,_std::allocator<S2CellId>_> *covering_local;
  S2RegionCoverer *this_local;
  
  local_20 = covering;
  covering_local = (vector<S2CellId,_std::allocator<S2CellId>_> *)this;
  iVar3 = Options::min_level(&this->options_);
  iVar4 = Options::max_level(&this->options_);
  if (iVar4 < iVar3) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x158,kFatal,(ostream *)&std::cerr);
    poVar9 = S2LogMessage::stream(&local_38);
    poVar9 = std::operator<<(poVar9,
                             "Check failed: (options_.min_level()) <= (options_.max_level()) ");
    S2LogMessageVoidify::operator&(&local_21,poVar9);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  iVar3 = Options::min_level(&this->options_);
  iVar4 = Options::true_max_level(&this->options_);
  iVar5 = Options::level_mod(&this->options_);
  sVar10 = std::vector<S2CellId,_std::allocator<S2CellId>_>::size(local_20);
  iVar6 = Options::max_cells(&this->options_);
  prev_id.id_._7_1_ = (ulong)(long)iVar6 < sVar10;
  prev_id.id_._0_4_ = 1;
  __range1 = (vector<S2CellId,_std::allocator<S2CellId>_> *)S2CellId::None();
  pvVar1 = local_20;
  __end1 = std::vector<S2CellId,_std::allocator<S2CellId>_>::begin(local_20);
  id.id_ = (uint64)std::vector<S2CellId,_std::allocator<S2CellId>_>::end(pvVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                *)&id);
    if (!bVar2) {
      return true;
    }
    pSVar11 = __gnu_cxx::
              __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
              ::operator*(&__end1);
    SStack_88.id_ = pSVar11->id_;
    bVar2 = S2CellId::is_valid(&stack0xffffffffffffff78);
    if (!bVar2) {
      return false;
    }
    iVar6 = S2CellId::level(&stack0xffffffffffffff78);
    pvVar1 = __range1;
    if ((iVar6 < iVar3) || (iVar4 < iVar6)) {
      return false;
    }
    if ((1 < iVar5) && ((iVar6 - iVar3) % iVar5 != 0)) break;
    SVar12 = S2CellId::None();
    bVar2 = ::operator!=((S2CellId)pvVar1,SVar12);
    if (bVar2) {
      SVar12 = S2CellId::range_max((S2CellId *)&__range1);
      SVar13 = S2CellId::range_min(&stack0xffffffffffffff78);
      bVar2 = operator>=(SVar12,SVar13);
      if (bVar2) {
        return false;
      }
      if (((prev_id.id_._7_1_ & 1) != 0) &&
         (iVar7 = S2CellId::GetCommonAncestorLevel(&stack0xffffffffffffff78,(S2CellId)__range1),
         iVar3 <= iVar7)) {
        return false;
      }
      iVar7 = iVar6 - iVar5;
      local_f9 = true;
      if (iVar3 <= iVar7) {
        iVar8 = S2CellId::level((S2CellId *)&__range1);
        local_f9 = true;
        if (iVar6 == iVar8) {
          SVar12 = S2CellId::parent(&stack0xffffffffffffff78,iVar7);
          SVar13 = S2CellId::parent((S2CellId *)&__range1,iVar7);
          local_f9 = ::operator!=(SVar12,SVar13);
        }
      }
      if (local_f9 == false) {
        prev_id.id_._0_4_ = (int)prev_id.id_ + 1;
        if ((int)prev_id.id_ == 1 << ((byte)(iVar5 << 1) & 0x1f)) {
          return false;
        }
      }
      else {
        prev_id.id_._0_4_ = 1;
      }
    }
    __range1 = (vector<S2CellId,_std::allocator<S2CellId>_> *)SStack_88.id_;
    __gnu_cxx::
    __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&__end1);
  }
  return false;
}

Assistant:

bool S2RegionCoverer::IsCanonical(const vector<S2CellId>& covering) const {
  // We check this on each call because of mutable_options().
  S2_DCHECK_LE(options_.min_level(), options_.max_level());

  const int min_level = options_.min_level();
  const int max_level = options_.true_max_level();
  const int level_mod = options_.level_mod();
  const bool too_many_cells = covering.size() > options_.max_cells();
  int same_parent_count = 1;
  S2CellId prev_id = S2CellId::None();
  for (const S2CellId id : covering) {
    if (!id.is_valid()) return false;

    // Check that the S2CellId level is acceptable.
    const int level = id.level();
    if (level < min_level || level > max_level) return false;
    if (level_mod > 1 && (level - min_level) % level_mod != 0) return false;

    if (prev_id != S2CellId::None()) {
      // Check that cells are sorted and non-overlapping.
      if (prev_id.range_max() >= id.range_min()) return false;

      // If there are too many cells, check that no pair of adjacent cells
      // could be replaced by an ancestor.
      if (too_many_cells && id.GetCommonAncestorLevel(prev_id) >= min_level) {
        return false;
      }

      // Check that there are no sequences of (4 ** level_mod) cells that all
      // have the same parent (considering only multiples of "level_mod").
      int plevel = level - level_mod;
      if (plevel < min_level || level != prev_id.level() ||
          id.parent(plevel) != prev_id.parent(plevel)) {
        same_parent_count = 1;
      } else if (++same_parent_count == (1 << (2 * level_mod))) {
        return false;
      }
    }
    prev_id = id;
  }
  return true;
}